

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.cpp
# Opt level: O3

CoverageBinSymbol *
slang::ast::CoverageBinSymbol::fromSyntax(Scope *scope,BinsSelectionSyntax *syntax)

{
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> *psVar1;
  TokenKind TVar2;
  Compilation *this;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  BinKind BVar3;
  CoverageBinSymbol *this_00;
  SourceLocation local_40;
  string_view local_38;
  
  this = scope->compilation;
  local_38 = parsing::Token::valueText(&syntax->name);
  local_40 = parsing::Token::location(&syntax->name);
  this_00 = BumpAllocator::
            emplace<slang::ast::CoverageBinSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                      (&this->super_BumpAllocator,&local_38,&local_40);
  (this_00->super_Symbol).originatingSyntax = (SyntaxNode *)syntax;
  psVar1 = &(syntax->super_MemberSyntax).attributes.
            super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>;
  syntax_00.data_ = psVar1->data_;
  syntax_00.size_ = psVar1->size_;
  if ((syntax->super_MemberSyntax).attributes.
      super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_ != 0 &&
      psVar1->data_ == (pointer)0x0) {
    std::terminate();
  }
  Symbol::setAttributes(&this_00->super_Symbol,scope,syntax_00);
  TVar2 = (syntax->keyword).kind;
  if (TVar2 == IgnoreBinsKeyword) {
    BVar3 = IgnoreBins;
  }
  else {
    if (TVar2 != IllegalBinsKeyword) {
      return this_00;
    }
    BVar3 = IllegalBins;
  }
  this_00->binsKind = BVar3;
  return this_00;
}

Assistant:

CoverageBinSymbol& CoverageBinSymbol::fromSyntax(const Scope& scope,
                                                 const BinsSelectionSyntax& syntax) {
    auto& comp = scope.getCompilation();
    auto result = comp.emplace<CoverageBinSymbol>(syntax.name.valueText(), syntax.name.location());
    result->setSyntax(syntax);
    result->setAttributes(scope, syntax.attributes);

    if (syntax.keyword.kind == TokenKind::IgnoreBinsKeyword)
        result->binsKind = IgnoreBins;
    else if (syntax.keyword.kind == TokenKind::IllegalBinsKeyword)
        result->binsKind = IllegalBins;

    return *result;
}